

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

int phosg::pipe(int *__pipedes)

{
  int iVar1;
  runtime_error *this;
  uint *puVar2;
  int error;
  int fds [2];
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = ::pipe(fds);
  if (iVar1 == 0) {
    return fds[0];
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  puVar2 = (uint *)__errno_location();
  string_for_error_abi_cxx11_(&local_58,(phosg *)(ulong)*puVar2,error);
  ::std::operator+(&local_38,"pipe failed: ",&local_58);
  ::std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

pair<int, int> pipe() {
  int fds[2];
  if (::pipe(fds)) {
    throw runtime_error("pipe failed: " + string_for_error(errno));
  }
  return make_pair(fds[0], fds[1]);
}